

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O0

void __thiscall
draco::VertexRingIterator<draco::MeshAttributeCornerTable>::Next
          (VertexRingIterator<draco::MeshAttributeCornerTable> *this)

{
  bool bVar1;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  ThisIndexType in_stack_ffffffffffffffec;
  CornerIndex in_stack_fffffffffffffff0;
  ThisIndexType local_c [3];
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    MeshAttributeCornerTable::SwingRight
              ((MeshAttributeCornerTable *)
               CONCAT44(in_stack_ffffffffffffffec.value_,*(undefined4 *)(in_RDI + 0xc)),
               in_stack_fffffffffffffff0);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
              ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),
               (ThisIndexType *)&stack0xffffffffffffffec);
  }
  else {
    local_c[0].value_ =
         (uint)MeshAttributeCornerTable::SwingLeft
                         ((MeshAttributeCornerTable *)
                          CONCAT44(in_stack_ffffffffffffffec.value_,in_stack_ffffffffffffffe8),
                          *(uint *)(in_RDI + 0xc));
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
              ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),local_c);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (bVar1) {
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),
                 (ThisIndexType *)(in_RDI + 8));
      *(undefined1 *)(in_RDI + 0x10) = 0;
    }
    else {
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                        ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),
                         (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 8));
      if (bVar1) {
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                  ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)(in_RDI + 0xc),
                   (ThisIndexType *)&kInvalidCornerIndex);
      }
    }
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = start_corner_;
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }